

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackSTGZGenerator.cxx
# Opt level: O3

int __thiscall cmCPackSTGZGenerator::GenerateHeader(cmCPackSTGZGenerator *this,ostream *os)

{
  pointer pcVar1;
  cmCPackLog *pcVar2;
  pointer pcVar3;
  cmCPackArchiveGenerator *pcVar4;
  ostream *poVar5;
  undefined8 msg;
  bool bVar6;
  int iVar7;
  size_t sVar8;
  string *psVar9;
  _Alloc_hider _Var10;
  long *plVar11;
  string line;
  string inLicFile;
  string licenseText;
  string inFile;
  string packageHeaderText;
  string res;
  char headerLengthTag [26];
  char buffer [1024];
  ifstream ilfs;
  ifstream ifs;
  string local_958;
  long *local_938 [2];
  long local_928 [2];
  undefined1 *local_918;
  undefined8 local_910;
  undefined1 local_908;
  undefined7 uStack_907;
  cmCPackArchiveGenerator *local_8f8;
  long *local_8f0 [2];
  long local_8e0 [2];
  undefined1 *local_8d0;
  undefined8 local_8c8;
  undefined1 local_8c0;
  undefined7 uStack_8bf;
  string local_8b0;
  ostream *local_890;
  long *local_888;
  long local_878 [2];
  char local_868 [32];
  undefined1 local_848 [112];
  ios_base local_7d8 [920];
  undefined1 local_440 [16];
  _func_int *local_430 [63];
  istream local_238;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_848);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_848,"Writing header",0xe);
  std::ios::widen((char)(ostringstream *)local_848 + (char)*(undefined8 *)(local_848._0_8_ + -0x18))
  ;
  std::ostream::put((char)local_848);
  std::ostream::flush();
  pcVar2 = (this->super_cmCPackArchiveGenerator).super_cmCPackGenerator.Logger;
  std::__cxx11::stringbuf::str();
  msg = local_440._0_8_;
  sVar8 = strlen((char *)local_440._0_8_);
  cmCPackLog::Log(pcVar2,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackSTGZGenerator.cxx"
                  ,0x48,(char *)msg,sVar8);
  if ((_func_int **)local_440._0_8_ != local_430) {
    operator_delete((void *)local_440._0_8_,(ulong)(local_430[0] + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_848);
  std::ios_base::~ios_base(local_7d8);
  pcVar1 = local_848 + 0x10;
  local_848._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_848,"CPACK_RESOURCE_FILE_LICENSE","");
  psVar9 = (string *)cmCPackGenerator::GetOption((cmCPackGenerator *)this,(string *)local_848);
  if (psVar9 == (string *)0x0) {
    psVar9 = &cmValue::Empty_abi_cxx11_;
  }
  local_938[0] = local_928;
  pcVar3 = (psVar9->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_938,pcVar3,pcVar3 + psVar9->_M_string_length);
  if ((pointer)local_848._0_8_ != pcVar1) {
    operator_delete((void *)local_848._0_8_,local_848._16_8_ + 1);
  }
  local_958._M_dataplus._M_p = (pointer)&local_958.field_2;
  local_958._M_string_length = 0;
  local_958.field_2._M_local_buf[0] = '\0';
  local_8f8 = &this->super_cmCPackArchiveGenerator;
  local_890 = os;
  std::ifstream::ifstream(local_440,(char *)local_938[0],_S_in);
  local_918 = &local_908;
  local_910 = 0;
  local_908 = 0;
  while( true ) {
    bVar6 = cmsys::SystemTools::GetLineFromStream
                      ((istream *)local_440,&local_958,(bool *)0x0,0xffffffffffffffff);
    if (!bVar6) break;
    local_848._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_848,local_958._M_dataplus._M_p,
               local_958._M_dataplus._M_p + local_958._M_string_length);
    std::__cxx11::string::append((char *)local_848);
    std::__cxx11::string::_M_append((char *)&local_918,local_848._0_8_);
    if ((pointer)local_848._0_8_ != pcVar1) {
      operator_delete((void *)local_848._0_8_,local_848._16_8_ + 1);
    }
  }
  local_848._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_848,"CPACK_RESOURCE_FILE_LICENSE_CONTENT","");
  pcVar4 = local_8f8;
  cmCPackGenerator::SetOptionIfNotSet
            (&local_8f8->super_cmCPackGenerator,(string *)local_848,(string *)&local_918);
  if ((pointer)local_848._0_8_ != pcVar1) {
    operator_delete((void *)local_848._0_8_,local_848._16_8_ + 1);
  }
  builtin_strncpy(local_868 + 0x10,"LENGTH###",10);
  builtin_strncpy(local_868,"###CPACK_HEADER_",0x10);
  local_848._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"CPACK_STGZ_HEADER_FILE","");
  psVar9 = (string *)
           cmCPackGenerator::GetOption(&pcVar4->super_cmCPackGenerator,(string *)local_848);
  if (psVar9 == (string *)0x0) {
    psVar9 = &cmValue::Empty_abi_cxx11_;
  }
  local_8f0[0] = local_8e0;
  pcVar3 = (psVar9->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_8f0,pcVar3,pcVar3 + psVar9->_M_string_length);
  if ((pointer)local_848._0_8_ != pcVar1) {
    operator_delete((void *)local_848._0_8_,local_848._16_8_ + 1);
  }
  std::ifstream::ifstream(&local_238,(char *)local_8f0[0],_S_in);
  local_8d0 = &local_8c0;
  local_8c8 = 0;
  local_8c0 = 0;
  while( true ) {
    bVar6 = cmsys::SystemTools::GetLineFromStream
                      (&local_238,&local_958,(bool *)0x0,0xffffffffffffffff);
    pcVar4 = local_8f8;
    if (!bVar6) break;
    local_848._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_848,local_958._M_dataplus._M_p,
               local_958._M_dataplus._M_p + local_958._M_string_length);
    std::__cxx11::string::append((char *)local_848);
    std::__cxx11::string::_M_append((char *)&local_8d0,local_848._0_8_);
    if ((pointer)local_848._0_8_ != pcVar1) {
      operator_delete((void *)local_848._0_8_,local_848._16_8_ + 1);
    }
  }
  local_8b0._M_string_length = 0;
  local_8b0.field_2._M_local_buf[0] = '\0';
  local_8b0._M_dataplus._M_p = (pointer)&local_8b0.field_2;
  (*(local_8f8->super_cmCPackGenerator)._vptr_cmCPackGenerator[0xd])
            (local_8f8,&local_8d0,&local_8b0);
  iVar7 = 0;
  _Var10._M_p = local_8b0._M_dataplus._M_p;
  do {
    if (*_Var10._M_p == '\n') {
      iVar7 = iVar7 + 1;
    }
    else if (*_Var10._M_p == '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_848);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_848,"Number of lines: ",0x11);
      plVar11 = (long *)std::ostream::operator<<(local_848,iVar7 + 1U);
      std::ios::widen((char)*(undefined8 *)(*plVar11 + -0x18) + (char)plVar11);
      std::ostream::put((char)plVar11);
      std::ostream::flush();
      pcVar2 = (pcVar4->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      plVar11 = local_888;
      sVar8 = strlen((char *)local_888);
      cmCPackLog::Log(pcVar2,4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackSTGZGenerator.cxx"
                      ,0x6c,(char *)plVar11,sVar8);
      if (local_888 != local_878) {
        operator_delete(local_888,local_878[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_848);
      std::ios_base::~ios_base(local_7d8);
      snprintf(local_848,0x400,"%d",(ulong)(iVar7 + 1U));
      cmsys::SystemTools::ReplaceString(&local_8b0,local_868,local_848);
      poVar5 = local_890;
      std::__ostream_insert<char,std::char_traits<char>>
                (local_890,local_8b0._M_dataplus._M_p,local_8b0._M_string_length);
      iVar7 = cmCPackArchiveGenerator::GenerateHeader(pcVar4,poVar5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8b0._M_dataplus._M_p != &local_8b0.field_2) {
        operator_delete(local_8b0._M_dataplus._M_p,
                        CONCAT71(local_8b0.field_2._M_allocated_capacity._1_7_,
                                 local_8b0.field_2._M_local_buf[0]) + 1);
      }
      if (local_8d0 != &local_8c0) {
        operator_delete(local_8d0,CONCAT71(uStack_8bf,local_8c0) + 1);
      }
      std::ifstream::~ifstream(&local_238);
      if (local_8f0[0] != local_8e0) {
        operator_delete(local_8f0[0],local_8e0[0] + 1);
      }
      if (local_918 != &local_908) {
        operator_delete(local_918,CONCAT71(uStack_907,local_908) + 1);
      }
      std::ifstream::~ifstream(local_440);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_958._M_dataplus._M_p != &local_958.field_2) {
        operator_delete(local_958._M_dataplus._M_p,
                        CONCAT71(local_958.field_2._M_allocated_capacity._1_7_,
                                 local_958.field_2._M_local_buf[0]) + 1);
      }
      if (local_938[0] != local_928) {
        operator_delete(local_938[0],local_928[0] + 1);
      }
      return iVar7;
    }
    _Var10._M_p = _Var10._M_p + 1;
  } while( true );
}

Assistant:

int cmCPackSTGZGenerator::GenerateHeader(std::ostream* os)
{
  cmCPackLogger(cmCPackLog::LOG_DEBUG, "Writing header" << std::endl);
  int counter = 0;

  std::string inLicFile = this->GetOption("CPACK_RESOURCE_FILE_LICENSE");
  std::string line;
  cmsys::ifstream ilfs(inLicFile.c_str());
  std::string licenseText;
  while (cmSystemTools::GetLineFromStream(ilfs, line)) {
    licenseText += line + "\n";
  }
  this->SetOptionIfNotSet("CPACK_RESOURCE_FILE_LICENSE_CONTENT", licenseText);

  const char headerLengthTag[] = "###CPACK_HEADER_LENGTH###";

  // Create the header
  std::string inFile = this->GetOption("CPACK_STGZ_HEADER_FILE");
  cmsys::ifstream ifs(inFile.c_str());
  std::string packageHeaderText;
  while (cmSystemTools::GetLineFromStream(ifs, line)) {
    packageHeaderText += line + "\n";
  }

  // Configure in the values
  std::string res;
  this->ConfigureString(packageHeaderText, res);

  // Count the lines
  const char* ptr = res.c_str();
  while (*ptr) {
    if (*ptr == '\n') {
      counter++;
    }
    ++ptr;
  }
  counter++;
  cmCPackLogger(cmCPackLog::LOG_DEBUG,
                "Number of lines: " << counter << std::endl);
  char buffer[1024];
  snprintf(buffer, sizeof(buffer), "%d", counter);
  cmSystemTools::ReplaceString(res, headerLengthTag, buffer);

  // Write in file
  *os << res;
  return this->Superclass::GenerateHeader(os);
}